

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_pkt.cc
# Opt level: O0

ssl_open_record_t __thiscall
bssl::dtls1_open_app_data
          (bssl *this,SSL *ssl,Span<unsigned_char> *out,size_t *out_consumed,uint8_t *out_alert,
          Span<unsigned_char> in)

{
  Span<unsigned_char> in_00;
  bool bVar1;
  uint16_t uVar2;
  int iVar3;
  ssl_open_record_t sVar4;
  uchar *data;
  size_t len;
  size_t in_R9;
  size_t *psVar5;
  Span<const_unsigned_char> record_00;
  Span<const_unsigned_char> local_e0;
  DTLSRecordNumber local_d0;
  undefined1 local_c4 [8];
  hm_header_st msg_hdr;
  CBS body;
  CBS cbs;
  uchar *local_88;
  undefined1 auStack_60 [4];
  ssl_open_record_t ret;
  Span<unsigned_char> record;
  DTLSRecordNumber record_number;
  uint8_t type;
  uint8_t *out_alert_local;
  size_t *out_consumed_local;
  Span<unsigned_char> *out_local;
  SSL *ssl_local;
  Span<unsigned_char> in_local;
  
  iVar3 = SSL_in_init((SSL *)this);
  if (iVar3 != 0) {
    __assert_fail("!SSL_in_init(ssl)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_pkt.cc"
                  ,0xa3,
                  "ssl_open_record_t bssl::dtls1_open_app_data(SSL *, Span<uint8_t> *, size_t *, uint8_t *, Span<uint8_t>)"
                 );
  }
  DTLSRecordNumber::DTLSRecordNumber((DTLSRecordNumber *)&record.size_);
  Span<unsigned_char>::Span((Span<unsigned_char> *)auStack_60);
  in_00.size_ = in_R9;
  in_00.data_ = out_alert;
  psVar5 = out_consumed;
  sVar4 = dtls_open_record((SSL *)this,(uint8_t *)((long)&record_number.combined_ + 7),
                           (DTLSRecordNumber *)&record.size_,(Span<unsigned_char> *)auStack_60,
                           (size_t *)out,(uint8_t *)out_consumed,in_00);
  if (sVar4 != ssl_open_record_success) {
    return sVar4;
  }
  if (record_number.combined_._7_1_ == '\x16') {
    uVar2 = ssl_protocol_version((SSL *)this);
    if (0x303 < uVar2) {
      Span<unsigned_char_const>::Span<bssl::Span<unsigned_char>,void,bssl::Span<unsigned_char>>
                ((Span<unsigned_char_const> *)&cbs.len,(Span<unsigned_char> *)auStack_60);
      record_00.size_ = (size_t)psVar5;
      record_00.data_ = local_88;
      bVar1 = dtls1_process_handshake_fragments
                        (this,(SSL *)out_consumed,(uint8_t *)record.size_,(DTLSRecordNumber)cbs.len,
                         record_00);
      if (!bVar1) {
        return ssl_open_record_error;
      }
      return ssl_open_record_discard;
    }
    data = Span<unsigned_char>::data((Span<unsigned_char> *)auStack_60);
    len = Span<unsigned_char>::size((Span<unsigned_char> *)auStack_60);
    CBS_init((CBS *)&body.len,data,len);
    bVar1 = dtls1_parse_fragment((CBS *)&body.len,(hm_header_st *)local_c4,(CBS *)&msg_hdr.frag_off)
    ;
    if (!bVar1) {
      ERR_put_error(0x10,0,0x6d,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_pkt.cc"
                    ,0xc3);
      *(undefined1 *)out_consumed = 0x32;
      return ssl_open_record_error;
    }
    if ((local_c4[0] == '\x14') &&
       ((uint)(ushort)msg_hdr._0_2_ == *(ushort *)(*(long *)(this + 0x38) + 4) - 1)) {
      if (((**(ushort **)(this + 0x38) >> 5 & 1) == 0) && (msg_hdr.msg_len == 0)) {
        *(int *)(*(long *)(this + 0x38) + 0x3cc) = *(int *)(*(long *)(this + 0x38) + 0x3cc) + 1;
        **(ushort **)(this + 0x38) = **(ushort **)(this + 0x38) & 0xffdf | 0x20;
      }
      return ssl_open_record_discard;
    }
  }
  if (record_number.combined_._7_1_ == '\x1a') {
    local_d0.combined_ = record.size_;
    Span<unsigned_char_const>::Span<bssl::Span<unsigned_char>,void,bssl::Span<unsigned_char>>
              ((Span<unsigned_char_const> *)&local_e0,(Span<unsigned_char> *)auStack_60);
    in_local.size_._4_4_ = dtls1_process_ack((SSL *)this,(uint8_t *)out_consumed,local_d0,local_e0);
  }
  else if (record_number.combined_._7_1_ == '\x17') {
    bVar1 = Span<unsigned_char>::empty((Span<unsigned_char> *)auStack_60);
    if (bVar1) {
      in_local.size_._4_4_ = ssl_open_record_discard;
    }
    else {
      ssl->method = _auStack_60;
      (ssl->config)._M_t.super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl = (SSL_CONFIG *)record.data_;
      in_local.size_._4_4_ = ssl_open_record_success;
    }
  }
  else {
    ERR_put_error(0x10,0,0xe1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_pkt.cc"
                  ,0xe0);
    *(undefined1 *)out_consumed = 10;
    in_local.size_._4_4_ = ssl_open_record_error;
  }
  return in_local.size_._4_4_;
}

Assistant:

ssl_open_record_t dtls1_open_app_data(SSL *ssl, Span<uint8_t> *out,
                                      size_t *out_consumed, uint8_t *out_alert,
                                      Span<uint8_t> in) {
  assert(!SSL_in_init(ssl));

  uint8_t type;
  DTLSRecordNumber record_number;
  Span<uint8_t> record;
  auto ret = dtls_open_record(ssl, &type, &record_number, &record, out_consumed,
                              out_alert, in);
  if (ret != ssl_open_record_success) {
    return ret;
  }

  if (type == SSL3_RT_HANDSHAKE) {
    // Process handshake fragments for DTLS 1.3 post-handshake messages.
    if (ssl_protocol_version(ssl) >= TLS1_3_VERSION) {
      if (!dtls1_process_handshake_fragments(ssl, out_alert, record_number,
                                             record)) {
        return ssl_open_record_error;
      }
      return ssl_open_record_discard;
    }

    // Parse the first fragment header to determine if this is a pre-CCS or
    // post-CCS handshake record. DTLS resets handshake message numbers on each
    // handshake, so renegotiations and retransmissions are ambiguous.
    //
    // TODO(crbug.com/42290594): Move this logic into
    // |dtls1_process_handshake_fragments| and integrate it into DTLS 1.3
    // retransmit conditions.
    CBS cbs, body;
    struct hm_header_st msg_hdr;
    CBS_init(&cbs, record.data(), record.size());
    if (!dtls1_parse_fragment(&cbs, &msg_hdr, &body)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_BAD_HANDSHAKE_RECORD);
      *out_alert = SSL_AD_DECODE_ERROR;
      return ssl_open_record_error;
    }

    if (msg_hdr.type == SSL3_MT_FINISHED &&
        msg_hdr.seq == ssl->d1->handshake_read_seq - 1) {
      if (!ssl->d1->sending_flight && msg_hdr.frag_off == 0) {
        // Retransmit our last flight of messages. If the peer sends the second
        // Finished, they may not have received ours. Only do this for the
        // first fragment, in case the Finished was fragmented.
        //
        // This is not really a timeout, but increment the timeout count so we
        // eventually give up.
        ssl->d1->num_timeouts++;
        ssl->d1->sending_flight = true;
      }
      return ssl_open_record_discard;
    }

    // Otherwise, this is a pre-CCS handshake message from an unsupported
    // renegotiation attempt. Fall through to the error path.
  }

  if (type == SSL3_RT_ACK) {
    return dtls1_process_ack(ssl, out_alert, record_number, record);
  }

  if (type != SSL3_RT_APPLICATION_DATA) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_UNEXPECTED_RECORD);
    *out_alert = SSL_AD_UNEXPECTED_MESSAGE;
    return ssl_open_record_error;
  }

  if (record.empty()) {
    return ssl_open_record_discard;
  }

  *out = record;
  return ssl_open_record_success;
}